

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_USADA8(DisasContext_conflict1 *s,arg_USADA8 *a)

{
  int iVar1;
  ulong uVar2;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar3;
  TCGTemp *ret;
  TCGTemp *pTVar4;
  uintptr_t o;
  TCGv_i32 pTVar5;
  TCGContext_conflict1 *tcg_ctx;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  uVar2 = s->features;
  if ((uVar2 & 8) != 0) {
    s_00 = s->uc->tcg_ctx;
    iVar1 = a->rn;
    ret = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    load_reg_var(s,(TCGv_i32)((long)ret - (long)s_00),iVar1);
    iVar1 = a->rm;
    pTVar3 = s->uc->tcg_ctx;
    pTVar4 = tcg_temp_new_internal_aarch64(pTVar3,TCG_TYPE_I32,false);
    pTVar5 = (TCGv_i32)((long)pTVar4 - (long)pTVar3);
    load_reg_var(s,pTVar5,iVar1);
    pTVar4 = (TCGTemp *)(pTVar5 + (long)s_00);
    local_48 = ret;
    local_40 = pTVar4;
    tcg_gen_callN_aarch64(s_00,helper_usad8_aarch64,ret,2,&local_48);
    tcg_temp_free_internal_aarch64(s_00,pTVar4);
    iVar1 = a->ra;
    if (iVar1 != 0xf) {
      pTVar3 = s->uc->tcg_ctx;
      pTVar4 = tcg_temp_new_internal_aarch64(pTVar3,TCG_TYPE_I32,false);
      pTVar5 = (TCGv_i32)((long)pTVar4 - (long)pTVar3);
      load_reg_var(s,pTVar5,iVar1);
      pTVar4 = (TCGTemp *)(pTVar5 + (long)s_00);
      tcg_gen_op3_aarch64(s_00,INDEX_op_add_i32,(TCGArg)ret,(TCGArg)ret,(TCGArg)pTVar4);
      tcg_temp_free_internal_aarch64(s_00,pTVar4);
    }
    store_reg(s,a->rd,(TCGv_i32)((long)ret - (long)s_00));
  }
  return SUB41(((uint)uVar2 & 8) >> 3,0);
}

Assistant:

static bool trans_USADA8(DisasContext *s, arg_USADA8 *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2;

    if (!ENABLE_ARCH_6) {
        return false;
    }

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    gen_helper_usad8(tcg_ctx, t1, t1, t2);
    tcg_temp_free_i32(tcg_ctx, t2);
    if (a->ra != 15) {
        t2 = load_reg(s, a->ra);
        tcg_gen_add_i32(tcg_ctx, t1, t1, t2);
        tcg_temp_free_i32(tcg_ctx, t2);
    }
    store_reg(s, a->rd, t1);
    return true;
}